

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool __thiscall nivalis::util::is_varname(util *this,string_view expr)

{
  byte bVar1;
  bool bVar2;
  util *puVar3;
  
  bVar1 = *(byte *)expr._M_len;
  if ((((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0x5f)) || (bVar1 == 0x27)) {
    bVar2 = true;
    if ((util *)0x1 < this) {
      puVar3 = (util *)0x1;
      do {
        bVar1 = ((byte *)expr._M_len)[(long)puVar3];
        if (((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) &&
            ((0x3c < bVar1 - 0x24 ||
             ((0x1800000010000009U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) == 0)))) &&
           (bVar1 != 0x2e && 9 < (byte)(bVar1 - 0x30))) goto LAB_00124a2b;
        puVar3 = puVar3 + 1;
      } while (this != puVar3);
    }
  }
  else {
LAB_00124a2b:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_varname(std::string_view expr) {
    if(!util::is_varname_first(expr[0])) return false;
    for (size_t k = 1; k < expr.size(); ++k) {
        if (!util::is_identifier(expr[k])) return false;
    }
    return true;
}